

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.h
# Opt level: O2

void __thiscall flow::lang::BuiltinHandlerSym::~BuiltinHandlerSym(BuiltinHandlerSym *this)

{
  CallableSym::~CallableSym(&this->super_CallableSym);
  operator_delete(this,0xb8);
  return;
}

Assistant:

explicit BuiltinHandlerSym(const NativeCallback& cb)
      : CallableSym(Symbol::BuiltinHandler, &cb, SourceLocation()) {}